

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O1

int GetSubRects(WebPPicture *prev_canvas,WebPPicture *curr_canvas,int is_key_frame,
               int is_first_frame,float quality,SubFrameParams *params)

{
  FrameRectangle *rect;
  int iVar1;
  int iVar2;
  int iVar3;
  
  rect = &params->rect_ll_;
  (params->rect_ll_).x_offset_ = 0;
  (params->rect_ll_).y_offset_ = 0;
  iVar3 = curr_canvas->height;
  (params->rect_ll_).width_ = curr_canvas->width;
  (params->rect_ll_).height_ = iVar3;
  iVar3 = GetSubRect(prev_canvas,curr_canvas,is_key_frame,is_first_frame,params->empty_rect_allowed_
                     ,1,quality,rect,&params->sub_frame_ll_);
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = rect->y_offset_;
    iVar1 = (params->rect_ll_).width_;
    iVar2 = (params->rect_ll_).height_;
    (params->rect_lossy_).x_offset_ = rect->x_offset_;
    (params->rect_lossy_).y_offset_ = iVar3;
    (params->rect_lossy_).width_ = iVar1;
    (params->rect_lossy_).height_ = iVar2;
    iVar3 = GetSubRect(prev_canvas,curr_canvas,is_key_frame,is_first_frame,
                       params->empty_rect_allowed_,0,quality,&params->rect_lossy_,
                       &params->sub_frame_lossy_);
  }
  return iVar3;
}

Assistant:

static int GetSubRects(const WebPPicture* const prev_canvas,
                       const WebPPicture* const curr_canvas, int is_key_frame,
                       int is_first_frame, float quality,
                       SubFrameParams* const params) {
  // Lossless frame rectangle.
  params->rect_ll_.x_offset_ = 0;
  params->rect_ll_.y_offset_ = 0;
  params->rect_ll_.width_ = curr_canvas->width;
  params->rect_ll_.height_ = curr_canvas->height;
  if (!GetSubRect(prev_canvas, curr_canvas, is_key_frame, is_first_frame,
                  params->empty_rect_allowed_, 1, quality,
                  &params->rect_ll_, &params->sub_frame_ll_)) {
    return 0;
  }
  // Lossy frame rectangle.
  params->rect_lossy_ = params->rect_ll_;  // seed with lossless rect.
  return GetSubRect(prev_canvas, curr_canvas, is_key_frame, is_first_frame,
                    params->empty_rect_allowed_, 0, quality,
                    &params->rect_lossy_, &params->sub_frame_lossy_);
}